

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLtree.c
# Opt level: O2

int htmlDocDump(FILE *f,xmlDocPtr cur)

{
  int iVar1;
  xmlChar *encoding;
  xmlCharEncodingHandler *encoder;
  xmlOutputBufferPtr buf;
  char *encoding_00;
  
  xmlInitParser();
  if (f != (FILE *)0x0 && cur != (xmlDocPtr)0x0) {
    encoding = htmlGetMetaEncoding(cur);
    encoder = htmlFindOutputEncoder((char *)encoding);
    buf = xmlOutputBufferCreateFile(f,encoder);
    if (buf != (xmlOutputBufferPtr)0x0) {
      htmlDocContentDumpOutput(buf,cur,encoding_00);
      iVar1 = xmlOutputBufferClose(buf);
      return iVar1;
    }
  }
  return -1;
}

Assistant:

int
htmlDocDump(FILE *f, xmlDocPtr cur) {
    xmlOutputBufferPtr buf;
    xmlCharEncodingHandlerPtr handler = NULL;
    const char *encoding;
    int ret;

    xmlInitParser();

    if ((cur == NULL) || (f == NULL)) {
	return(-1);
    }

    encoding = (const char *) htmlGetMetaEncoding(cur);
    handler = htmlFindOutputEncoder(encoding);
    buf = xmlOutputBufferCreateFile(f, handler);
    if (buf == NULL)
        return(-1);
    htmlDocContentDumpOutput(buf, cur, NULL);

    ret = xmlOutputBufferClose(buf);
    return(ret);
}